

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa_asn1.cc
# Opt level: O3

rsa_st * EVP_PKEY_get1_RSA(EVP_PKEY *pkey)

{
  RSA *r;
  
  if (pkey->save_type == 6) {
    r = *(RSA **)&pkey->references;
    if (r == (RSA *)0x0) {
      r = (RSA *)0x0;
    }
    else {
      RSA_up_ref(r);
    }
  }
  else {
    r = (RSA *)0x0;
    ERR_put_error(6,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                  ,0xba);
  }
  return r;
}

Assistant:

RSA *EVP_PKEY_get1_RSA(const EVP_PKEY *pkey) {
  RSA *rsa = EVP_PKEY_get0_RSA(pkey);
  if (rsa != NULL) {
    RSA_up_ref(rsa);
  }
  return rsa;
}